

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O3

MusInfo * I_RegisterSong(FileReader *reader,MidiDeviceSetting *device)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var3;
  BYTE *pBVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  MusInfo *pMVar5;
  undefined4 extraout_var_04;
  MemoryArrayReader *pMVar6;
  char *fmt;
  int iVar7;
  ulong uVar8;
  DWORD subid;
  DWORD id [8];
  int local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  
  if (nomusic == 0) {
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&local_58,0x20);
    if ((CONCAT44(extraout_var,iVar2) == 0x20) &&
       (iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])
                          (reader,0xffffffffffffffe0,1), CONCAT44(extraout_var_00,iVar2) == 0)) {
      if ((local_58 & 0xffffff) != 0x88b1f) {
LAB_00337383:
        iVar2 = MUSHeaderSearch((BYTE *)&local_58,0x20);
        iVar7 = 4;
        if (-1 < iVar2) goto LAB_0033739b;
        if ((int)local_58 < 0x4d494d48) {
          if (local_58 == 0x20544143) {
LAB_003375b5:
            iVar7 = 3;
            if (local_50 == 0x44494d58) {
LAB_0033739b:
              pMVar5 = (MusInfo *)
                       (*(code *)(&DAT_005e2214 + *(int *)(&DAT_005e2214 + (ulong)(iVar7 - 1) * 4)))
                                 ();
              return pMVar5;
            }
            goto LAB_003375c5;
          }
          if (local_58 != 0x2d494d48) goto LAB_003375c5;
          if ((local_54 == 0x4944494d) && (iVar7 = 2, local_50 == 0x474e4f53)) goto LAB_0033739b;
LAB_003375dd:
          if ((local_54 == 0x4c504f57 && local_58 == 0x41524244) ||
             ((local_54 & 0xff) == 0x42 && local_58 == 0x494c4441)) goto LAB_00337607;
          fmt = GME_CheckFormat(0);
          if ((fmt == (char *)0x0) || (*fmt == '\0')) {
            pMVar6 = (MemoryArrayReader *)MOD_OpenSong(reader);
          }
          else {
            pMVar6 = (MemoryArrayReader *)GME_OpenSong(reader,fmt);
          }
          if (pMVar6 != (MemoryArrayReader *)0x0) goto LAB_0033764b;
          if (local_58 == 0x46464952) {
            (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
              _vptr_FileReaderBase[4])(reader,8,1);
            iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                      _vptr_FileReaderBase[2])(reader,&local_5c,4);
            pp_Var3 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                      _vptr_FileReaderBase;
            if (CONCAT44(extraout_var_04,iVar2) != 4) {
              (*pp_Var3[1])(reader);
              return (MusInfo *)0x0;
            }
            (*pp_Var3[4])(reader,0xfffffffffffffff4,1);
            if (local_5c == 0x41444443) {
              pMVar6 = (MemoryArrayReader *)operator_new(0x18);
              CDDAFile::CDDAFile((CDDAFile *)pMVar6,reader);
              goto LAB_0033764b;
            }
          }
          if (((((MemoryArrayReader *)reader)->super_FileReader).Length < 0x400) &&
             (local_58 != 0x6468544d)) {
            pMVar6 = (MemoryArrayReader *)0x0;
            goto LAB_0033764b;
          }
          pMVar6 = (MemoryArrayReader *)operator_new(0x18);
          StreamSong::StreamSong((StreamSong *)pMVar6,reader);
          reader = (FileReader *)pMVar6;
        }
        else {
          if (local_58 == 0x4d494d48) {
            iVar7 = 2;
            if (local_54 == 0x50494449) goto LAB_0033739b;
            goto LAB_003375dd;
          }
          if (local_58 == 0x4d524f46) {
            iVar7 = 3;
            if (local_50 == 0x52494458) goto LAB_0033739b;
            goto LAB_003375b5;
          }
          iVar7 = 1;
          if (local_58 == 0x6468544d) goto LAB_0033739b;
LAB_003375c5:
          if (local_54 != 0x41544144 || local_58 != 0x41574152) goto LAB_003375dd;
LAB_00337607:
          pMVar6 = (MemoryArrayReader *)operator_new(0x20);
          if (device == (MidiDeviceSetting *)0x0) {
            pBVar4 = "";
          }
          else {
            pBVar4 = (BYTE *)(device->args).Chars;
          }
          OPLMUSSong::OPLMUSSong((OPLMUSSong *)pMVar6,reader,(char *)pBVar4);
LAB_0033764b:
          (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
            _vptr_FileReaderBase[1])(reader);
          reader = &pMVar6->super_FileReader;
          if (pMVar6 == (MemoryArrayReader *)0x0) {
            return (MusInfo *)0x0;
          }
        }
        iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                  _vptr_FileReaderBase[10])(reader);
        if ((char)iVar2 != '\0') {
          return (MusInfo *)(MemoryArrayReader *)reader;
        }
        pp_Var3 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                  _vptr_FileReaderBase;
        goto LAB_003372a4;
      }
      iVar7 = (int)reader->Length;
      uVar8 = (ulong)iVar7;
      pBVar4 = (BYTE *)operator_new__(uVar8);
      iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar4,uVar8);
      if (CONCAT44(extraout_var_01,iVar2) == uVar8) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])(reader);
        reader = (FileReader *)operator_new(0x40);
        MemoryArrayReader::MemoryArrayReader((MemoryArrayReader *)reader,(char *)0x0,0);
        bVar1 = ungzip(pBVar4,iVar7,&((MemoryArrayReader *)reader)->buf);
        operator_delete__(pBVar4);
        if (bVar1) {
          (((MemoryArrayReader *)reader)->super_FileReader).Length =
               (ulong)(((MemoryArrayReader *)reader)->buf).Count;
          iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                    _vptr_FileReaderBase[2])(reader,&local_58,0x20);
          if ((CONCAT44(extraout_var_02,iVar2) == 0x20) &&
             (iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                        _vptr_FileReaderBase[4])(reader,0xffffffffffffffe0,1),
             CONCAT44(extraout_var_03,iVar2) == 0)) goto LAB_00337383;
        }
      }
      else {
        operator_delete__(pBVar4);
      }
    }
  }
  else if (reader == (FileReader *)0x0) {
    return (MusInfo *)0x0;
  }
  pp_Var3 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
            _vptr_FileReaderBase;
LAB_003372a4:
  (*pp_Var3[1])(reader);
  return (MusInfo *)0x0;
}

Assistant:

MusInfo *I_RegisterSong (FileReader *reader, MidiDeviceSetting *device)
{
	MusInfo *info = NULL;
	const char *fmt;
	DWORD id[32/4];

	if (nomusic)
	{
		delete reader;
		return 0;
	}

	if(reader->Read(id, 32) != 32 || reader->Seek(-32, SEEK_CUR) != 0)
	{
		delete reader;
		return 0;
	}

    // Check for gzip compression. Some formats are expected to have players
    // that can handle it, so it simplifies things if we make all songs
    // gzippable.
	if ((id[0] & MAKE_ID(255, 255, 255, 0)) == GZIP_ID)
	{
		int len = reader->GetLength();
		BYTE *gzipped = new BYTE[len];
		if (reader->Read(gzipped, len) != len)
		{
			delete[] gzipped;
			delete reader;
			return NULL;
		}
		delete reader;

		MemoryArrayReader *memreader = new MemoryArrayReader(NULL, 0);
		if (!ungzip(gzipped, len, memreader->GetArray()))
		{
			delete[] gzipped;
			delete memreader;
			return 0;
		}
		delete[] gzipped;
		memreader->UpdateLength();

		if (memreader->Read(id, 32) != 32 || memreader->Seek(-32, SEEK_CUR) != 0)
		{
			delete memreader;
			return 0;
		}
		reader = memreader;
	}

	EMIDIType miditype = IdentifyMIDIType(id, sizeof(id));
	if (miditype != MIDI_NOTMIDI)
	{
		EMidiDevice devtype = device == NULL? MDEV_DEFAULT : (EMidiDevice)device->device;
#ifndef _WIN32
		// non-Windows platforms don't support MDEV_MMAPI so map to MDEV_SNDSYS
		if (devtype == MDEV_MMAPI)
			devtype = MDEV_SNDSYS;
#endif

retry_as_sndsys:
		info = CreateMIDIStreamer(*reader, devtype, miditype, device != NULL? device->args.GetChars() : "");
		if (info != NULL && !info->IsValid())
		{
			delete info;
			info = NULL;
		}
		if (info == NULL && devtype != MDEV_SNDSYS && snd_mididevice < 0)
		{
			devtype = MDEV_SNDSYS;
			goto retry_as_sndsys;
		}
#ifdef _WIN32
		if (info == NULL && devtype != MDEV_MMAPI && snd_mididevice >= 0)
		{
			info = CreateMIDIStreamer(*reader, MDEV_MMAPI, miditype, "");
		}
#endif
	}

	// Check for various raw OPL formats
	else if (
		(id[0] == MAKE_ID('R','A','W','A') && id[1] == MAKE_ID('D','A','T','A')) ||		// Rdos Raw OPL
		(id[0] == MAKE_ID('D','B','R','A') && id[1] == MAKE_ID('W','O','P','L')) ||		// DosBox Raw OPL
		(id[0] == MAKE_ID('A','D','L','I') && *((BYTE *)id + 4) == 'B'))		// Martin Fernandez's modified IMF
	{
		info = new OPLMUSSong (*reader, device != NULL? device->args.GetChars() : "");
	}
	// Check for game music
	else if ((fmt = GME_CheckFormat(id[0])) != NULL && fmt[0] != '\0')
	{
		info = GME_OpenSong(*reader, fmt);
	}
	// Check for module formats
	else
	{
		info = MOD_OpenSong(*reader);
	}

    if (info == NULL)
    {
        // Check for CDDA "format"
        if (id[0] == (('R')|(('I')<<8)|(('F')<<16)|(('F')<<24)))
        {
            DWORD subid;

            reader->Seek(8, SEEK_CUR);
            if (reader->Read (&subid, 4) != 4)
            {
                delete reader;
                return 0;
            }
            reader->Seek(-12, SEEK_CUR);

            if (subid == (('C')|(('D')<<8)|(('D')<<16)|(('A')<<24)))
            {
                // This is a CDDA file
                info = new CDDAFile (*reader);
            }
        }

        // no support in sound system => no modules/streams
        // 1024 bytes is an arbitrary restriction. It's assumed that anything
        // smaller than this can't possibly be a valid music file if it hasn't
        // been identified already, so don't even bother trying to load it.
        // Of course MIDIs shorter than 1024 bytes should pass.
        if (info == NULL && (reader->GetLength() >= 1024 || id[0] == MAKE_ID('M','T','h','d')))
        {
            // Let the sound system figure out what it is.
            info = new StreamSong (reader);
			// Assumed ownership
			reader = NULL;
        }
    }

	if (reader != NULL) delete reader;

	if (info && !info->IsValid ())
	{
		delete info;
		info = NULL;
	}

	return info;
}